

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<IntView<3>_>::push(vec<IntView<3>_> *this,IntView<3> *elem)

{
  int iVar1;
  int iVar2;
  IntView<3> *pIVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = this->sz;
  if (uVar4 == this->cap) {
    uVar5 = 2;
    if (1 < uVar4) {
      uVar5 = (ulong)(uVar4 * 3 + 1 >> 1);
    }
    this->cap = (uint)uVar5;
    pIVar3 = (IntView<3> *)realloc(this->data,uVar5 << 4);
    this->data = pIVar3;
    uVar4 = this->sz;
  }
  else {
    pIVar3 = this->data;
  }
  this->sz = uVar4 + 1;
  iVar1 = elem->a;
  iVar2 = elem->b;
  pIVar3 = pIVar3 + uVar4;
  pIVar3->var = elem->var;
  pIVar3->a = iVar1;
  pIVar3->b = iVar2;
  return;
}

Assistant:

void push(const T& elem) {
		if (sz == cap) {
			cap = cap <= 1 ? 2 : (cap * 3 + 1) >> 1;
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
		new (&data[sz++]) T(elem);
	}